

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmargins.cpp
# Opt level: O1

QDebug operator<<(QDebug dbg,QMarginsF *m)

{
  QTextStream *pQVar1;
  _func_int **pp_Var2;
  storage_type *in_RCX;
  double *in_RDX;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QByteArrayView ba_02;
  QDebugStateSaver saver;
  QDebugStateSaver local_48;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_48,(QDebug *)m);
  pQVar1 = (QTextStream *)m->m_left;
  *(undefined1 *)&pQVar1[3]._vptr_QTextStream = 0;
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)"QMarginsF";
  QString::fromUtf8(&local_40,(QString *)0x9,ba);
  QTextStream::operator<<(pQVar1,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(char *)&((QTextStream *)m->m_left)[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<((QTextStream *)m->m_left,' ');
  }
  QTextStream::operator<<((QTextStream *)m->m_left,'(');
  if (*(char *)&((QTextStream *)m->m_left)[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<((QTextStream *)m->m_left,' ');
  }
  QTextStream::operator<<((QTextStream *)m->m_left,*in_RDX);
  if (*(char *)&((QTextStream *)m->m_left)[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<((QTextStream *)m->m_left,' ');
  }
  pQVar1 = (QTextStream *)m->m_left;
  ba_00.m_data = in_RCX;
  ba_00.m_size = (qsizetype)", ";
  QString::fromUtf8(&local_40,(QString *)0x2,ba_00);
  QTextStream::operator<<(pQVar1,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(char *)&((QTextStream *)m->m_left)[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<((QTextStream *)m->m_left,' ');
  }
  QTextStream::operator<<((QTextStream *)m->m_left,in_RDX[1]);
  if (*(char *)&((QTextStream *)m->m_left)[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<((QTextStream *)m->m_left,' ');
  }
  pQVar1 = (QTextStream *)m->m_left;
  ba_01.m_data = in_RCX;
  ba_01.m_size = (qsizetype)", ";
  QString::fromUtf8(&local_40,(QString *)0x2,ba_01);
  QTextStream::operator<<(pQVar1,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(char *)&((QTextStream *)m->m_left)[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<((QTextStream *)m->m_left,' ');
  }
  QTextStream::operator<<((QTextStream *)m->m_left,in_RDX[2]);
  if (*(char *)&((QTextStream *)m->m_left)[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<((QTextStream *)m->m_left,' ');
  }
  pQVar1 = (QTextStream *)m->m_left;
  ba_02.m_data = in_RCX;
  ba_02.m_size = (qsizetype)", ";
  QString::fromUtf8(&local_40,(QString *)0x2,ba_02);
  QTextStream::operator<<(pQVar1,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(char *)&((QTextStream *)m->m_left)[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<((QTextStream *)m->m_left,' ');
  }
  QTextStream::operator<<((QTextStream *)m->m_left,in_RDX[3]);
  if (*(char *)&((QTextStream *)m->m_left)[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<((QTextStream *)m->m_left,' ');
  }
  QTextStream::operator<<((QTextStream *)m->m_left,')');
  if (*(char *)&((QTextStream *)m->m_left)[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<((QTextStream *)m->m_left,' ');
  }
  pp_Var2 = (_func_int **)m->m_left;
  m->m_left = 0.0;
  ((dbg.stream)->ts)._vptr_QTextStream = pp_Var2;
  QDebugStateSaver::~QDebugStateSaver(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QMarginsF &m)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    dbg << "QMarginsF" << '(';
    QtDebugUtils::formatQMargins(dbg, m);
    dbg << ')';
    return dbg;
}